

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.h
# Opt level: O0

void __thiscall
jrtplib::RTPTCPTransmissionParams::~RTPTCPTransmissionParams(RTPTCPTransmissionParams *this)

{
  RTPTCPTransmissionParams *this_local;
  
  ~RTPTCPTransmissionParams(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

class JRTPLIB_IMPORTEXPORT RTPTCPTransmissionParams : public RTPTransmissionParams
{
public:
	RTPTCPTransmissionParams();

	/** If non null, the specified abort descriptors will be used to cancel
	 *  the function that's waiting for packets to arrive; set to null (the default)
	 *  to let the transmitter create its own instance. */
	void SetCreatedAbortDescriptors(RTPAbortDescriptors *desc) { m_pAbortDesc = desc; }

	/** If non-null, this RTPAbortDescriptors instance will be used internally,
	 *  which can be useful when creating your own poll thread for multiple
	 *  sessions. */
	RTPAbortDescriptors *GetCreatedAbortDescriptors() const		{ return m_pAbortDesc; }
private:
	RTPAbortDescriptors *m_pAbortDesc;
}